

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_phase_spectrum.cc
# Opt level: O1

bool __thiscall
sptk::FilterCoefficientsToPhaseSpectrum::Run
          (FilterCoefficientsToPhaseSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *phase_spectrum,Buffer *buffer)

{
  long lVar1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if (this->is_valid_ == true) {
    iVar4 = this->num_numerator_order_;
    lVar1 = (long)iVar4 + 1;
    if ((long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == lVar1) {
      if (buffer == (Buffer *)0x0) {
        return false;
      }
      if (phase_spectrum == (vector<double,_std::allocator<double>_> *)0x0) {
        return false;
      }
      lVar13 = (long)this->num_denominator_order_ + 1;
      if ((long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 != lVar13) {
        return false;
      }
      iVar5 = this->fft_length_;
      uVar12 = iVar5 / 2 + 1;
      if ((long)(phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)(int)uVar12) {
        std::vector<double,_std::allocator<double>_>::resize(phase_spectrum,(long)(int)uVar12);
      }
      this_00 = &buffer->real_part1_;
      if ((long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->fft_length_);
      }
      this_01 = &buffer->real_part2_;
      if ((long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->fft_length_);
      }
      pdVar6 = (numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      sVar14 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6;
      if (sVar14 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar6,sVar14);
      }
      pdVar7 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = pdVar7 + lVar1;
      if (pdVar6 != pdVar8) {
        memset(pdVar6,0,((long)pdVar8 + (-0x10 - (long)(pdVar7 + iVar4)) & 0xfffffffffffffff8U) + 8)
        ;
      }
      pdVar6 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
      sVar14 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar6;
      if (sVar14 != 0) {
        memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar6,sVar14);
      }
      pdVar7 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar13;
      if (pdVar6 != pdVar7) {
        memset(pdVar6,0,((long)pdVar7 + (-8 - (long)pdVar6) & 0xfffffffffffffff8U) + 8);
      }
      bVar11 = RealValuedFastFourierTransform::Run
                         (&this->fast_fourier_transform_,this_00,&buffer->imag_part1_,
                          &buffer->buffer_for_fast_fourier_transform_);
      if (bVar11) {
        *(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 1.0;
        bVar11 = RealValuedFastFourierTransform::Run
                           (&this->fast_fourier_transform_,this_01,&buffer->imag_part2_,
                            &buffer->buffer_for_fast_fourier_transform_);
        if (bVar11) {
          if (iVar5 < -1) {
            return true;
          }
          pdVar6 = (phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (buffer->imag_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar10 = (buffer->imag_part2_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar18 = 0.0;
          uVar15 = 0;
          do {
            dVar16 = pdVar9[uVar15];
            dVar17 = pdVar8[uVar15];
            dVar2 = pdVar7[uVar15];
            dVar3 = pdVar10[uVar15];
            dVar16 = atan2(dVar16 * dVar17 - dVar3 * dVar2,dVar2 * dVar17 + dVar16 * dVar3);
            dVar16 = dVar16 * 0.3183098861837907;
            pdVar6[uVar15] = dVar16;
            if ((uVar15 != 0) && (this->unwrapping_ != false)) {
              dVar17 = (dVar16 - pdVar6[uVar15 - 1]) + dVar18;
              if (dVar17 <= 1.0) {
                if (dVar17 < -1.0) {
                  dVar18 = dVar18 + 2.0;
                }
              }
              else {
                dVar18 = dVar18 + -2.0;
              }
              pdVar6[uVar15] = dVar16 + dVar18;
            }
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToPhaseSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* phase_spectrum,
    FilterCoefficientsToPhaseSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == phase_spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (phase_spectrum->size() != static_cast<std::size_t>(output_length)) {
    phase_spectrum->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }

  std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
            buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + numerator_length,
            buffer->real_part1_.end(), 0.0);
  std::copy(denominator_coefficients.begin(), denominator_coefficients.end(),
            buffer->real_part2_.begin());
  std::fill(buffer->real_part2_.begin() + denominator_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  buffer->real_part2_[0] = 1.0;
  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*phase_spectrum)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  const double inverse_pi(1.0 / sptk::kPi);
  double offset(0.0);

  for (int i(0); i < output_length; ++i) {
    output[i] = inverse_pi * std::atan2(xi[i] * yr[i] - xr[i] * yi[i],
                                        xr[i] * yr[i] + xi[i] * yi[i]);
    if (unwrapping_ && 0 < i) {
      const double diff(output[i] - output[i - 1] + offset);
      if (1.0 < diff) {
        offset -= 2.0;
      } else if (1.0 < -diff) {
        offset += 2.0;
      }
      output[i] += offset;
    }
  }

  return true;
}